

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

void __thiscall crnlib::texture_conversion::convert_params::print(convert_params *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mipmapped_texture *pmVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  uint uVar8;
  char *pcVar9;
  
  uVar8 = 0;
  console::debug("\nTexture conversion parameters:");
  pmVar4 = this->m_pInput_texture;
  uVar1 = pmVar4->m_width;
  uVar2 = pmVar4->m_height;
  uVar3 = (pmVar4->m_faces).m_size;
  if (uVar3 != 0) {
    uVar8 = ((pmVar4->m_faces).m_p)->m_size;
  }
  pcVar7 = pixel_format_helpers::get_pixel_format_string(pmVar4->m_format);
  bVar5 = mipmapped_texture::is_x_flipped(this->m_pInput_texture);
  bVar6 = mipmapped_texture::is_y_flipped(this->m_pInput_texture);
  console::debug("   Resolution: %ux%u, Faces: %u, Levels: %u, Format: %s, X Flipped: %u, Y Flipped: %u"
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar8,pcVar7,(ulong)bVar5,
                 (ulong)bVar6);
  pcVar7 = get_texture_type_desc(this->m_texture_type);
  console::debug("      texture_type: %s",pcVar7);
  pcVar7 = (this->m_dst_filename).m_pStr;
  pcVar9 = "";
  if (pcVar7 != (char *)0x0) {
    pcVar9 = pcVar7;
  }
  console::debug("      dst_filename: %s",pcVar9);
  pcVar7 = texture_file_types::get_extension(this->m_dst_file_type);
  console::debug("     dst_file_type: %s",pcVar7);
  pcVar7 = pixel_format_helpers::get_pixel_format_string(this->m_dst_format);
  console::debug("        dst_format: %s",pcVar7);
  console::debug("             quick: %u",(ulong)this->m_quick);
  console::debug(" use_source_format: %u",(ulong)this->m_always_use_source_pixel_format);
  console::debug("            Y Flip: %u",(ulong)this->m_y_flip);
  console::debug("            Unflip: %u",(ulong)this->m_unflip);
  return;
}

Assistant:

void convert_params::print() {
  console::debug("\nTexture conversion parameters:");
  console::debug("   Resolution: %ux%u, Faces: %u, Levels: %u, Format: %s, X Flipped: %u, Y Flipped: %u",
                 m_pInput_texture->get_width(),
                 m_pInput_texture->get_height(),
                 m_pInput_texture->get_num_faces(),
                 m_pInput_texture->get_num_levels(),
                 pixel_format_helpers::get_pixel_format_string(m_pInput_texture->get_format()),
                 m_pInput_texture->is_x_flipped(),
                 m_pInput_texture->is_y_flipped());

  console::debug("      texture_type: %s", get_texture_type_desc(m_texture_type));
  console::debug("      dst_filename: %s", m_dst_filename.get_ptr());
  console::debug("     dst_file_type: %s", texture_file_types::get_extension(m_dst_file_type));
  console::debug("        dst_format: %s", pixel_format_helpers::get_pixel_format_string(m_dst_format));
  console::debug("             quick: %u", m_quick);
  console::debug(" use_source_format: %u", m_always_use_source_pixel_format);
  console::debug("            Y Flip: %u", m_y_flip);
  console::debug("            Unflip: %u", m_unflip);
}